

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O2

string * __thiscall
duckdb::UUIDStatisticsState::GetMaxValue_abi_cxx11_
          (string *__return_storage_ptr__,UUIDStatisticsState *this)

{
  int iVar1;
  
  iVar1 = (*(this->super_ColumnWriterStatistics)._vptr_ColumnWriterStatistics[2])(this);
  if ((char)iVar1 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this->max,&this->field_0x29);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetMaxValue() override {
		return HasStats() ? string(char_ptr_cast(max), 16) : string();
	}